

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int fftsud(fitsfile *mfptr,HDUtracker *HDU,int newPosition,char *newFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int status;
  int hdunum;
  char filename2 [1025];
  char filename1 [1025];
  int local_858;
  int local_854;
  char *local_850;
  char local_848 [1040];
  char local_438 [1032];
  
  local_858 = 0;
  ffghdn(mfptr,&local_854);
  local_858 = ffflnm(mfptr,local_438,&local_858);
  iVar2 = ffrtnm(local_438,local_848,&local_858);
  iVar1 = HDU->nHDU;
  local_858 = iVar2;
  if ((long)iVar1 < 1) {
    uVar4 = 0;
LAB_00172add:
    iVar3 = 0x156;
    if ((int)uVar4 != iVar1) {
      if (newPosition != 0) {
        HDU->newPosition[uVar4 & 0xffffffff] = newPosition;
      }
      iVar3 = iVar2;
      if (newFileName != (char *)0x0) {
        strcpy(HDU->newFilename[uVar4 & 0xffffffff],newFileName);
        iVar3 = local_858;
      }
    }
  }
  else {
    uVar4 = 0;
    local_850 = newFileName;
    do {
      if ((HDU->position[uVar4] == local_854) &&
         (iVar3 = strcmp(HDU->filename[uVar4],local_848), newFileName = local_850, iVar3 == 0))
      goto LAB_00172add;
      uVar4 = uVar4 + 1;
    } while ((long)iVar1 != uVar4);
    iVar3 = 0x156;
  }
  return iVar3;
}

Assistant:

int fftsud(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int         newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  update the HDU information in the HDUtracker struct pointed to by HDU. The 
  HDU to update is pointed to by mfptr. If non-zero, the value of newPosition
  is used to update the HDU->newPosition[] value for the mfptr, and if
  non-NULL the newFileName value is used to update the HDU->newFilename[]
  value for mfptr.
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];


  /* retrieve the HDU's position within the FITS file */
  
  fits_get_hdu_num(mfptr,&hdunum);
  
  /* retrieve the HDU's file name */
  
  status = fits_file_name(mfptr,filename1,&status);
  
  /* parse the file name and construct the "standard" URL for it */
      
  status = ffrtnm(filename1,filename2,&status);

  /* 
     examine all the existing HDUs in the HDUtracker an see if this HDU
     has already been registered
  */

  for(i = 0; i < HDU->nHDU && 
      !(HDU->position[i] == hdunum && strcmp(HDU->filename[i],filename2) == 0);
      ++i);

  /* if previously registered then change newPosition and newFileName */

  if(i != HDU->nHDU) 
    {
      if(newPosition  != 0) HDU->newPosition[i] = newPosition;
      if(newFileName  != NULL) 
	{
	  strcpy(HDU->newFilename[i],newFileName);
	}
    }
  else
    status = MEMBER_NOT_FOUND;
 
  return(status);
}